

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx> *this,
          PolarExtentCoreContext *ctx,PositionBatch<xsimd::batch<float,_xsimd::avx>_> *position)

{
  undefined1 auVar1 [32];
  bool bVar2;
  undefined7 extraout_var;
  PolarExtentCoreContext *ctx_00;
  PolarExtentCoreContext *ctx_01;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar6;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  float fVar11;
  undefined4 uVar12;
  float fVar13;
  undefined4 uVar14;
  float fVar15;
  undefined4 uVar16;
  float fVar17;
  undefined1 auVar5 [32];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  batch_bool<float,_xsimd::avx> in_straight_line_part;
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> position_t;
  simd_register<float,_xsimd::avx> sin_angle;
  undefined1 auVar21 [32];
  batch_bool<float,_xsimd::avx> local_e0;
  PositionBatch<xsimd::batch<float,_xsimd::avx>_> local_c0;
  
  PositionBatch<xsimd::batch<float,_xsimd::avx>_>::transform
            (&local_c0,(PositionBatch<xsimd::batch<float,_xsimd::avx>_> *)ctx,
             (extent_float_t *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4));
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5._16_4_ = 0x7fffffff;
  auVar5._20_4_ = 0x7fffffff;
  auVar5._24_4_ = 0x7fffffff;
  auVar5._28_4_ = 0x7fffffff;
  sin_angle.data =
       (register_type)vandps_avx(auVar5,local_c0.x.super_simd_register<float,_xsimd::avx>.data);
  fVar19 = *(float *)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar17 = *(float *)((long)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar20._0_4_ =
       fVar19 * sin_angle.data[0] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[0] * fVar17;
  auVar20._4_4_ =
       fVar19 * sin_angle.data[1] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[1] * fVar17;
  auVar20._8_4_ =
       fVar19 * sin_angle.data[2] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[2] * fVar17;
  auVar20._12_4_ =
       fVar19 * sin_angle.data[3] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[3] * fVar17;
  auVar20._16_4_ =
       fVar19 * sin_angle.data[4] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[4] * fVar17;
  auVar20._20_4_ =
       fVar19 * sin_angle.data[5] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[5] * fVar17;
  auVar20._24_4_ =
       fVar19 * sin_angle.data[6] +
       local_c0.y.super_simd_register<float,_xsimd::avx>.data[6] * fVar17;
  auVar20._28_4_ = fVar19 + fVar17;
  local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data =
       (get_bool_simd_register_t<float,_xsimd::avx>)vcmpps_avx(ZEXT832(0) << 0x20,auVar20,2);
  auVar5 = vandps_avx(auVar5,(undefined1  [32])
                             local_c0.z.super_simd_register<float,_xsimd::avx>.data);
  uVar3 = auVar5._28_4_;
  uVar6 = 0;
  uVar8 = 0;
  uVar10 = 0;
  uVar12 = 0;
  uVar14 = 0;
  uVar16 = 0;
  fVar18 = 0.0;
  weight_from_sin(__return_storage_ptr__,this,ctx_00,(batch)sin_angle.data);
  fVar19 = *(float *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  fVar17 = *(float *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  fVar4 = fVar19 * sin_angle.data[0] +
          fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[0];
  fVar7 = fVar19 * sin_angle.data[1] +
          fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[1];
  fVar9 = fVar19 * sin_angle.data[2] +
          fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[2];
  fVar11 = fVar19 * sin_angle.data[3] +
           fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[3];
  fVar13 = fVar19 * sin_angle.data[4] +
           fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[4];
  fVar15 = fVar19 * sin_angle.data[5] +
           fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[5];
  fVar17 = fVar19 * sin_angle.data[6] +
           fVar17 * local_c0.y.super_simd_register<float,_xsimd::avx>.data[6];
  fVar19 = fVar19 + fVar18;
  weight_from_cos(__return_storage_ptr__,this,ctx_01,(batch)sin_angle.data);
  auVar21._4_4_ = fVar7;
  auVar21._0_4_ = fVar4;
  auVar21._8_4_ = fVar9;
  auVar21._12_4_ = fVar11;
  auVar21._16_4_ = fVar13;
  auVar21._20_4_ = fVar15;
  auVar21._24_4_ = fVar17;
  auVar21._28_4_ = fVar19;
  bVar2 = xsimd::all<float,xsimd::avx>(&local_e0);
  if ((!bVar2) &&
     (((((((((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data >>
             0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           ((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data >>
            0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          ((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data >> 0x5f
          & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data >>
                0x7f,0) != '\0') ||
        ((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data &
        (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data >>
              0xbf,0) != '\0') ||
      ((undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data &
      (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
      local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data[7]._3_1_ < '\0')) {
    auVar1._4_4_ = uVar6;
    auVar1._0_4_ = uVar3;
    auVar1._8_4_ = uVar8;
    auVar1._12_4_ = uVar10;
    auVar1._16_4_ = uVar12;
    auVar1._20_4_ = uVar14;
    auVar1._24_4_ = uVar16;
    auVar1._28_4_ = fVar18;
    vblendvps_avx(auVar21,auVar1,
                  (undefined1  [32])local_e0.super_get_bool_simd_register_t<float,_xsimd::avx>.data)
    ;
  }
  return (batch *)CONCAT71(extraout_var,bVar2);
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }